

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefiledeps.cpp
# Opt level: O2

bool __thiscall QMakeSourceFileInfo::isSystemInclude(QMakeSourceFileInfo *this,QString *name)

{
  long lVar1;
  char cVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_88;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  QDir systemDir;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  cVar2 = QDir::isRelativePath((QString *)name);
  if (cVar2 == '\0') {
    lVar5 = 0;
    for (uVar4 = 0; uVar4 < (ulong)(this->systemIncludes).d.size; uVar4 = uVar4 + 1) {
      _systemDir = 0xaaaaaaaaaaaaaaaa;
      QDir::QDir(&systemDir,(QString *)((long)&(((this->systemIncludes).d.ptr)->d).d + lVar5));
      local_58.size = -0x5555555555555556;
      local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_58.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      QDir::relativeFilePath((QString *)&local_58);
      bVar3 = QDir::isAbsolutePath((QString *)&local_58);
      if (!bVar3) {
        QString::QString((QString *)&local_70,"../");
        cVar2 = QString::startsWith((QString *)&local_58,(CaseSensitivity)&local_70);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
        if (cVar2 == '\0') {
          if (Option::debug_level != 0) {
            QString::toLocal8Bit((QByteArray *)&local_70,name);
            if (local_70.ptr == (char16_t *)0x0) {
              local_70.ptr = (char16_t *)&QByteArray::_empty;
            }
            QString::toLocal8Bit
                      ((QByteArray *)&local_88,
                       (QString *)((long)&(((this->systemIncludes).d.ptr)->d).d + lVar5));
            if (local_88.ptr == (char *)0x0) {
              local_88.ptr = (char *)&QByteArray::_empty;
            }
            debug_msg_internal(5,"File/dir %s is in system dir %s, skipping",local_70.ptr,
                               local_88.ptr);
            QArrayDataPointer<char>::~QArrayDataPointer(&local_88);
            QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_70);
          }
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
          QDir::~QDir(&systemDir);
          bVar3 = true;
          goto LAB_0016a996;
        }
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      QDir::~QDir(&systemDir);
      lVar5 = lVar5 + 0x18;
    }
  }
  bVar3 = false;
LAB_0016a996:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QMakeSourceFileInfo::isSystemInclude(const QString &name)
{
    if (QDir::isRelativePath(name)) {
        // if we got a relative path here, it's either an -I flag with a relative path
        // or an include file we couldn't locate. Either way, conclude it's not
        // a system include.
        return false;
    }

    for (int i = 0; i < systemIncludes.size(); ++i) {
        // check if name is located inside the system include dir:
        QDir systemDir(systemIncludes.at(i));
        QString relativePath = systemDir.relativeFilePath(name);

        // the relative path might be absolute if we're crossing drives on Windows
        if (QDir::isAbsolutePath(relativePath) || relativePath.startsWith("../"))
            continue;
        debug_msg(5, "File/dir %s is in system dir %s, skipping",
                  qPrintable(name), qPrintable(systemIncludes.at(i)));
        return true;
    }
    return false;
}